

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::FlushLogFilesUnsafe(int min_severity)

{
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *puVar1;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *__last;
  anon_class_8_1_ba1d6636 __f;
  int min_severity_local;
  
  puVar1 = std::
           begin<std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>,4ul>
                     ((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                       (*) [4])log_destinations_);
  puVar1 = std::
           next<std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>*>
                     (puVar1,(long)min_severity);
  __last = std::
           end<std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>,4ul>
                     ((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                       (*) [4])log_destinations_);
  __f.now.__d.__r = (time_point)std::chrono::_V2::system_clock::now();
  std::
  for_each<std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>*,google::LogDestination::FlushLogFilesUnsafe(int)::_lambda(std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>&)_1_>
            (puVar1,__last,__f);
  return;
}

Assistant:

inline void LogDestination::FlushLogFilesUnsafe(int min_severity) {
  // assume we have the log_mutex or we simply don't care
  // about it
  std::for_each(std::next(std::begin(log_destinations_), min_severity),
                std::end(log_destinations_),
                [now = std::chrono::system_clock::now()](
                    std::unique_ptr<LogDestination>& log) {
                  if (log != nullptr) {
                    // Flush the base fileobject_ logger directly instead of
                    // going through any wrappers to reduce chance of deadlock.
                    log->fileobject_.FlushUnlocked(now);
                  }
                });
}